

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O2

void __thiscall HighsCutPool::lpCutRemoved(HighsCutPool *this,HighsInt cut)

{
  int *piVar1;
  long lVar2;
  HighsInt local_24;
  key_type local_20;
  
  lVar2 = (long)cut;
  if ((this->matrix_).colsLinked.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar2] != '\0') {
    local_20 = (key_type)((ulong)(uint)cut << 0x20 | 0xffffffff);
    local_24 = cut;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::erase(&(this->propRows)._M_t,&local_20);
    local_20.first = 1;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_emplace_unique<int,int&>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&this->propRows,&local_20.first,&local_24);
    lVar2 = (long)local_24;
  }
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar2] = 1;
  this->numLpCuts = this->numLpCuts + -1;
  piVar1 = (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void HighsCutPool::lpCutRemoved(HighsInt cut) {
  if (matrix_.columnsLinked(cut)) {
    propRows.erase(std::make_pair(-1, cut));
    propRows.emplace(1, cut);
  }
  ages_[cut] = 1;
  --numLpCuts;
  ++ageDistribution[1];
}